

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20.cpp
# Opt level: O0

void __thiscall
FSChaCha20::FSChaCha20(FSChaCha20 *this,Span<const_std::byte> key,uint32_t rekey_interval)

{
  long lVar1;
  Span<const_std::byte> key_00;
  size_t sVar2;
  undefined4 in_ECX;
  size_t in_RSI;
  byte *in_RDI;
  long in_FS_OFFSET;
  ChaCha20 *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  key_00.m_size = in_RSI;
  key_00.m_data = in_RDI;
  ChaCha20::ChaCha20(in_stack_ffffffffffffffb8,key_00);
  *(undefined4 *)(in_RDI + 0x74) = in_ECX;
  in_RDI[0x78] = 0;
  in_RDI[0x79] = 0;
  in_RDI[0x7a] = 0;
  in_RDI[0x7b] = 0;
  in_RDI[0x80] = 0;
  in_RDI[0x81] = 0;
  in_RDI[0x82] = 0;
  in_RDI[0x83] = 0;
  in_RDI[0x84] = 0;
  in_RDI[0x85] = 0;
  in_RDI[0x86] = 0;
  in_RDI[0x87] = 0;
  sVar2 = Span<const_std::byte>::size((Span<const_std::byte> *)in_stack_ffffffffffffffb8);
  if (sVar2 != 0x20) {
    __assert_fail("key.size() == KEYLEN",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/crypto/chacha20.cpp"
                  ,0x15b,"FSChaCha20::FSChaCha20(Span<const std::byte>, uint32_t)");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

FSChaCha20::FSChaCha20(Span<const std::byte> key, uint32_t rekey_interval) noexcept :
    m_chacha20(key), m_rekey_interval(rekey_interval)
{
    assert(key.size() == KEYLEN);
}